

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_26UL> *param_5)

{
  CappedArray<char,_5UL> *params;
  CappedArray<char,_5UL> CVar1;
  CappedArray<char,_26UL> local_68;
  CappedArray<char,_5UL> local_40;
  size_t local_30;
  undefined4 local_28;
  char local_24;
  undefined8 *local_20;
  DebugComparison<unsigned_char_&,_unsigned_long> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  CVar1 = tryToCharSequence<unsigned_char,kj::CappedArray<char,5ul>>((uchar *)*param_2);
  local_40.currentSize = CVar1.currentSize;
  local_30 = local_40.currentSize;
  local_40.content._0_4_ = CVar1.content._0_4_;
  local_28._0_1_ = local_40.content[0];
  local_28._1_1_ = local_40.content[1];
  local_28._2_1_ = local_40.content[2];
  local_28._3_1_ = local_40.content[3];
  local_40.content[4] = CVar1.content[4];
  local_24 = local_40.content[4];
  params = (CappedArray<char,_5UL> *)(local_20 + 2);
  local_40 = CVar1;
  tryToCharSequence<unsigned_long,kj::CappedArray<char,26ul>>
            (&local_68,(_ *)(local_20 + 1),CVar1._8_8_);
  concat<kj::CappedArray<char,5ul>,kj::StringPtr&,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_30,params,(StringPtr *)&local_68,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}